

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall SolverTest_GetIntOption_Test::TestBody(SolverTest_GetIntOption_Test *this)

{
  SolverOptionManager *this_00;
  bool bVar1;
  SolverOption *pSVar2;
  char *pcVar3;
  longlong value;
  AssertionResult gtest_ar;
  TestSolverWithOptions test_solver;
  AssertHelper local_3b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  AssertHelper local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  TestSolverWithOptions local_368;
  
  TestSolverWithOptions::TestSolverWithOptions(&local_368);
  local_390.data_._0_4_ = 0;
  this_00 = &local_368.super_Solver.super_BasicSolver.super_SolverOptionManager;
  pSVar2 = mp::SolverOptionManager::GetOption(this_00,"intopt1");
  local_3a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (*pSVar2->_vptr_SolverOption[3])(pSVar2);
  local_3b0.data_ = (AssertHelperData *)local_3a8.ptr_;
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&local_3a0,"0","s.GetIntOption(\"intopt1\")",(int *)&local_390,
             (longlong *)&local_3b0);
  if (local_3a0.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_398.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_398.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x392,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((AssertHelperData *)local_3a8.ptr_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_3a8.ptr_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.ptr_ + 8))();
      }
      local_3a8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368.intopt1 = 0x2a;
  local_390.data_._0_4_ = 0x2a;
  pSVar2 = mp::SolverOptionManager::GetOption(this_00,"intopt1");
  local_3a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (*pSVar2->_vptr_SolverOption[3])(pSVar2);
  local_3b0.data_ = (AssertHelperData *)local_3a8.ptr_;
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&local_3a0,"42","s.GetIntOption(\"intopt1\")",(int *)&local_390,
             (longlong *)&local_3b0);
  if (local_3a0.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_398.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_398.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x394,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((AssertHelperData *)local_3a8.ptr_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_3a8.ptr_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.ptr_ + 8))();
      }
      local_3a8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    pSVar2 = mp::SolverOptionManager::GetOption(this_00,"intopt1");
    local_3a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    (*pSVar2->_vptr_SolverOption[4])(pSVar2);
  }
  testing::Message::Message((Message *)&local_3a0);
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",0x395
             ,
             "Expected: s.GetDblOption(\"intopt1\") throws an exception of type OptionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  if (local_3a0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_3a0.ptr_ + 8))();
    }
    local_3a0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    pSVar2 = mp::SolverOptionManager::GetOption(this_00,"intopt1");
    mp::SolverOption::GetValue<std::__cxx11::string>(&local_388,pSVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_3a0);
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",0x396
             ,
             "Expected: s.GetStrOption(\"intopt1\") throws an exception of type OptionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  if (local_3a0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_3a0.ptr_ + 8))();
    }
    local_3a0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    pSVar2 = mp::SolverOptionManager::GetOption(this_00,"badopt");
    local_3a0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    (*pSVar2->_vptr_SolverOption[3])(pSVar2);
  }
  testing::Message::Message((Message *)&local_3b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_390,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",0x397
             ,
             "Expected: s.GetIntOption(\"badopt\") throws an exception of type OptionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_3b0);
  testing::internal::AssertHelper::~AssertHelper(&local_390);
  if (local_3b0.data_ != (AssertHelperData *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    local_3b0.data_ = (AssertHelperData *)0x0;
  }
  local_368.super_Solver.super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__TestSolverWithOptions_0028bb70;
  local_368.super_Solver.super_BasicSolver.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__TestSolverWithOptions_0028bbe0;
  local_368.super_Solver.super_BasicSolver.super_Interrupter._vptr_Interrupter =
       (_func_int **)&PTR__TestSolverWithOptions_0028bc08;
  local_368.super_Solver.super_BasicSolver.super_SolverOptionManager._vptr_SolverOptionManager =
       (_func_int **)&PTR__TestSolverWithOptions_0028bc38;
  local_368.super_Solver.super_BasicSolver.super_SolveResultRegistry._vptr_SolveResultRegistry =
       (_func_int **)&PTR__TestSolverWithOptions_0028bc58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.stropt2._M_dataplus._M_p != &local_368.stropt2.field_2) {
    operator_delete(local_368.stropt2._M_dataplus._M_p,
                    local_368.stropt2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.stropt1._M_dataplus._M_p != &local_368.stropt1.field_2) {
    operator_delete(local_368.stropt1._M_dataplus._M_p,
                    local_368.stropt1.field_2._M_allocated_capacity + 1);
  }
  local_368.super_Solver.super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__Solver_0028adb8;
  local_368.super_Solver.super_BasicSolver.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__Solver_0028ae28;
  local_368.super_Solver.super_BasicSolver.super_Interrupter._vptr_Interrupter =
       (_func_int **)&PTR__Solver_0028ae50;
  local_368.super_Solver.super_BasicSolver.super_SolverOptionManager._vptr_SolverOptionManager =
       (_func_int **)&PTR__Solver_0028ae80;
  local_368.super_Solver.super_BasicSolver.super_SolveResultRegistry._vptr_SolveResultRegistry =
       (_func_int **)&PTR__Solver_0028aea0;
  if (local_368.super_Solver.suffixes_.
      super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.super_Solver.suffixes_.
                    super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_368.super_Solver.suffixes_.
                          super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.super_Solver.suffixes_.
                          super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  mp::BasicSolver::~BasicSolver((BasicSolver *)&local_368);
  return;
}

Assistant:

TEST(SolverTest, GetIntOption) {
  TestSolverWithOptions test_solver;
  Solver &s = test_solver;
  EXPECT_EQ(0, s.GetIntOption("intopt1"));
  test_solver.intopt1 = 42;
  EXPECT_EQ(42, s.GetIntOption("intopt1"));
  EXPECT_THROW(s.GetDblOption("intopt1"), OptionError);
  EXPECT_THROW(s.GetStrOption("intopt1"), OptionError);
  EXPECT_THROW(s.GetIntOption("badopt"), OptionError);
}